

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  int iVar1;
  Arena *pAVar2;
  btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
  *this_00;
  uint uVar3;
  Extension *pEVar4;
  MessageLite *pMVar5;
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  Arena *arena;
  ExtensionSet *const_this;
  int iStack_44;
  ulong uStack_40;
  undefined1 auStack_38 [16];
  
  puVar8 = auStack_38;
  uStack_40 = 0x13b86a;
  pEVar4 = FindOrNull(this,number);
  if (pEVar4 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar4->is_repeated == false) {
    if (0xed < (byte)(pEVar4->type - 0x13)) {
      puVar8 = (undefined1 *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4);
      if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 10) {
        pAVar2 = this->arena_;
        if ((pEVar4->field_0xa & 4) == 0) {
          pMVar5 = (MessageLite *)(pEVar4->field_0).int64_t_value;
          if (pAVar2 != (Arena *)0x0) {
            uStack_40 = 0x13b8bc;
            pMVar5 = MessageLite::New(pMVar5,(Arena *)0x0);
            uStack_40 = 0x13b8ca;
            MessageLite::CheckTypeAndMergeFrom(pMVar5,(MessageLite *)pEVar4->field_0);
          }
        }
        else {
          uStack_40 = 0x13b8e0;
          pMVar5 = (MessageLite *)
                   (**(code **)(**(long **)&(pEVar4->field_0).int32_t_value + 0x40))
                             (*(long **)&(pEVar4->field_0).int32_t_value,prototype,pAVar2);
          if ((pAVar2 == (Arena *)0x0) && ((long *)(pEVar4->field_0).int64_t_value != (long *)0x0))
          {
            uStack_40 = 0x13b8f6;
            (**(code **)(*(long *)(pEVar4->field_0).int64_t_value + 8))();
          }
        }
        uStack_40 = 0x13b900;
        Erase(this,number);
        return pMVar5;
      }
      goto LAB_0013b921;
    }
  }
  else {
    uStack_40 = 0x13b919;
    ReleaseMessage((ExtensionSet *)auStack_38);
  }
  uStack_40 = 0x13b921;
  ReleaseMessage((ExtensionSet *)auStack_38);
LAB_0013b921:
  uStack_40 = 0x13b929;
  iStack_44 = (int)auStack_38;
  ReleaseMessage();
  pMVar5 = (MessageLite *)(long)*(short *)(puVar8 + 10);
  this_00 = *(btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              **)(puVar8 + 0x10);
  uStack_40 = (ulong)(uint)number;
  if ((long)pMVar5 < 0) {
    pMVar5 = (MessageLite *)
             absl::lts_20240722::container_internal::
             btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
             ::erase<int>(this_00,&iStack_44);
  }
  else if (*(short *)(puVar8 + 10) != 0) {
    lVar7 = (long)pMVar5 * 0x20;
    lVar6 = 0;
    do {
      iVar1 = *(int *)((long)&(this_00->tree_).root_ + lVar6);
      if (iVar1 != iStack_44 && iStack_44 <= iVar1) {
        return pMVar5;
      }
      if (iVar1 == iStack_44) {
        if (lVar7 + -0x20 != lVar6) {
          memmove((void *)((long)&(this_00->tree_).root_ + lVar6),
                  (void *)((long)&this_00[1].tree_.rightmost_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*,_2UL,_false>
                                  .value + lVar6),(lVar7 - lVar6) - 0x20);
          pMVar5 = (MessageLite *)(ulong)*(ushort *)(puVar8 + 10);
        }
        uVar3 = (int)pMVar5 - 1;
        *(short *)(puVar8 + 10) = (short)uVar3;
        return (MessageLite *)(ulong)uVar3;
      }
      lVar6 = lVar6 + 0x20;
    } while (lVar7 != lVar6);
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}